

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

void __thiscall
math::wide_integer::uintwide_t<48U,_unsigned_char,_void,_false>::eval_divide_by_single_limb
          (uintwide_t<48U,_unsigned_char,_void,_false> *this,limb_type_conflict1 short_denominator,
          unsigned_fast_type u_offset,uintwide_t<48U,_unsigned_char,_void,_false> *remainder)

{
  bool bVar1;
  uchar uVar2;
  iterator it;
  uchar *x;
  reference pvVar3;
  byte *pbVar4;
  undefined4 local_48;
  undefined2 local_44;
  unsigned_short local_42;
  reverse_iterator<unsigned_char_*> local_40;
  reverse_iterator<unsigned_char_*> local_38;
  reverse_iterator ri;
  limb_type_conflict1 hi_part;
  double_limb_type long_numerator;
  uintwide_t<48U,_unsigned_char,_void,_false> *remainder_local;
  unsigned_fast_type u_offset_local;
  limb_type_conflict1 short_denominator_local;
  uintwide_t<48U,_unsigned_char,_void,_false> *this_local;
  
  ri.current._6_2_ = 0;
  ri.current._5_1_ = 0;
  it = detail::array_detail::array<unsigned_char,_6UL>::begin((array<unsigned_char,_6UL> *)this);
  x = detail::advance_and_point<unsigned_char*,unsigned_int>(it,6 - (int)u_offset);
  detail::iterator_detail::reverse_iterator<unsigned_char_*>::reverse_iterator(&local_38,x);
  while( true ) {
    local_40.current =
         (uchar *)detail::array_detail::array<unsigned_char,_6UL>::rend
                            ((array<unsigned_char,_6UL> *)this);
    bVar1 = detail::iterator_detail::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    pbVar4 = detail::iterator_detail::reverse_iterator<unsigned_char_*>::operator*(&local_38);
    ri.current._6_2_ =
         (ushort)*pbVar4 +
         (ri.current._6_2_ - (ushort)short_denominator * (ushort)ri.current._5_1_) * 0x100;
    local_42 = (unsigned_short)((ulong)ri.current._6_2_ / (ulong)(long)(int)(uint)short_denominator)
    ;
    uVar2 = detail::make_lo<unsigned_char,unsigned_short>(&local_42);
    pvVar3 = detail::iterator_detail::reverse_iterator<unsigned_char_*>::operator*(&local_38);
    *pvVar3 = uVar2;
    pbVar4 = detail::iterator_detail::reverse_iterator<unsigned_char_*>::operator*(&local_38);
    ri.current._5_1_ = *pbVar4;
    detail::iterator_detail::reverse_iterator<unsigned_char_*>::operator++(&local_38);
  }
  if (remainder != (uintwide_t<48U,_unsigned_char,_void,_false> *)0x0) {
    pbVar4 = detail::array_detail::array<unsigned_char,_6UL>::cbegin
                       ((array<unsigned_char,_6UL> *)this);
    ri.current._6_2_ =
         (ushort)*pbVar4 +
         (ri.current._6_2_ - (ushort)short_denominator * (ushort)ri.current._5_1_) * 0x100;
    uintwide_t<48u,unsigned_char,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
    enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::value)&&(std
    ::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_char>::digits),void>::
    type__(&local_48,(uchar)(ri.current._6_2_ >> 8),
           (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
            *)0x0);
    *(undefined4 *)(remainder->values).super_array<unsigned_char,_6UL>.elems = local_48;
    *(undefined2 *)((remainder->values).super_array<unsigned_char,_6UL>.elems + 4) = local_44;
  }
  return;
}

Assistant:

constexpr auto eval_divide_by_single_limb(const limb_type          short_denominator,
                                              const unsigned_fast_type u_offset,
                                                    uintwide_t*        remainder) -> void
    {
      // The denominator has one single limb.
      // Use a one-dimensional division algorithm.

      auto long_numerator = double_limb_type { };
      auto hi_part        = static_cast<limb_type>(UINT8_C(0));

      {
        reverse_iterator
          ri
          {
            detail::advance_and_point
            (
              values.begin(),
              static_cast<size_t>(number_of_limbs - static_cast<size_t>(u_offset))
            )
          };

        for( ; ri != values.rend(); ++ri) // NOLINT(altera-id-dependent-backward-branch)
        {
          long_numerator =
            static_cast<double_limb_type>
            (
               *ri
             + static_cast<double_limb_type>
               (
                    static_cast<double_limb_type>
                    (
                        long_numerator
                      - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                    )
                 << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
               )
            );

          *ri = detail::make_lo<limb_type>(static_cast<double_limb_type>(long_numerator / short_denominator));

          hi_part = *ri;
        }
      }

      if(remainder != nullptr)
      {
        long_numerator =
          static_cast<double_limb_type>
          (
             static_cast<double_limb_type>(*values.cbegin())
           + static_cast<double_limb_type>
             (
                  static_cast<double_limb_type>
                  (
                    long_numerator - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                  )
               << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
             )
          );

        *remainder =
          static_cast<limb_type>
          (
            long_numerator >> static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
          );
      }
    }